

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMS_TAGGED_PCR_SELECT_Array_Unmarshal
                 (TPMS_TAGGED_PCR_SELECT *target,BYTE **buffer,INT32 *size,INT32 count)

{
  TPM_RC TVar1;
  long lVar2;
  
  if (count < 1) {
    count = 0;
  }
  lVar2 = (ulong)(uint)count + 1;
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      return 0;
    }
    TVar1 = TPMS_TAGGED_PCR_SELECT_Unmarshal(target,buffer,size);
    target = target + 1;
  } while (TVar1 == 0);
  return TVar1;
}

Assistant:

TPM_RC
TPMS_TAGGED_PCR_SELECT_Array_Unmarshal(TPMS_TAGGED_PCR_SELECT *target, BYTE **buffer, INT32 *size, INT32 count)
{
    TPM_RC    result;
    INT32 i;
    for(i = 0; i < count; i++) {
        result = TPMS_TAGGED_PCR_SELECT_Unmarshal(&target[i], buffer, size);
        if(result != TPM_RC_SUCCESS)
            return result;
    }
    return TPM_RC_SUCCESS;
}